

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

L2NormalizeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_l2normalize(NeuralNetworkLayer *this)

{
  ulong uVar1;
  L2NormalizeLayerParams *pLVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0xaa) {
    clear_layer(this);
    this->_oneof_case_[0] = 0xaa;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pLVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::L2NormalizeLayerParams>(arena);
    (this->layer_).l2normalize_ = pLVar2;
  }
  return (L2NormalizeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::L2NormalizeLayerParams* NeuralNetworkLayer::_internal_mutable_l2normalize() {
  if (!_internal_has_l2normalize()) {
    clear_layer();
    set_has_l2normalize();
    layer_.l2normalize_ = CreateMaybeMessage< ::CoreML::Specification::L2NormalizeLayerParams >(GetArenaForAllocation());
  }
  return layer_.l2normalize_;
}